

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_list.c
# Opt level: O2

int main(void)

{
  list_test_item *plVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  void *__ptr;
  void *pvVar5;
  long lVar6;
  int i;
  uint uVar7;
  char *__assertion;
  UpnpListHead list;
  
  UpnpListInit(&list);
  for (i = 0; i != 10; i = i + 1) {
    plVar1 = list_test_item__new(i);
    uVar2 = UpnpListEnd(&list);
    UpnpListInsert(&list,uVar2,plVar1);
  }
  lVar3 = UpnpListBegin(&list);
  uVar7 = 0;
  while( true ) {
    lVar4 = UpnpListEnd(&list);
    if (lVar3 == lVar4) break;
    printf("List item index: %i, expected: %i\n",(ulong)*(uint *)(lVar3 + 0x10),(ulong)uVar7);
    if (uVar7 != *(uint *)(lVar3 + 0x10)) {
      __assertion = "item->index == i";
      uVar7 = 0x33;
      goto LAB_001013a9;
    }
    uVar7 = uVar7 + 1;
    lVar3 = UpnpListNext(&list,lVar3);
  }
  lVar3 = UpnpListBegin(&list);
  lVar4 = UpnpListEnd(&list);
  if (lVar3 == lVar4) {
    __assertion = "UpnpListBegin(&list) != UpnpListEnd(&list)";
    uVar7 = 0x3b;
  }
  else {
    __ptr = (void *)UpnpListBegin(&list);
    uVar7 = 0;
    while( true ) {
      pvVar5 = (void *)UpnpListEnd(&list);
      if (__ptr == pvVar5) break;
      printf("List item index: %i, expected: %i\n",(ulong)*(uint *)((long)__ptr + 0x10),(ulong)uVar7
            );
      if (uVar7 != *(uint *)((long)__ptr + 0x10)) {
        __assertion = "item->index == i";
        uVar7 = 0x48;
        goto LAB_001013a9;
      }
      uVar7 = uVar7 + 1;
      pvVar5 = (void *)UpnpListErase(&list,__ptr);
      free(__ptr);
      __ptr = pvVar5;
    }
    lVar3 = UpnpListBegin(&list);
    lVar4 = UpnpListEnd(&list);
    if (lVar3 == lVar4) {
      lVar3 = UpnpListBegin(&list);
      lVar4 = UpnpListNext(&list,lVar3);
      lVar6 = UpnpListEnd(&list);
      if (lVar4 == lVar6) {
        lVar4 = UpnpListEnd(&list);
        if (lVar3 == lVar4) {
          return 0;
        }
        __assertion = "list_iter == UpnpListEnd(&list)";
        uVar7 = 0x55;
      }
      else {
        __assertion = "UpnpListNext(&list, list_iter) == UpnpListEnd(&list)";
        uVar7 = 0x54;
      }
    }
    else {
      __assertion = "UpnpListBegin(&list) == UpnpListEnd(&list)";
      uVar7 = 0x51;
    }
  }
LAB_001013a9:
  __assert_fail(__assertion,"upnp/test/test_list.c",uVar7,"int main(void)");
}

Assistant:

int main(void)
{
	int i;
	UpnpListHead list;
	UpnpListInit(&list);

	/* Fill list with items */
	for (i = 0; i < 10; i++) {
		struct list_test_item *item = list_test_item__new(i);

		UpnpListInsert(&list, UpnpListEnd(&list), &item->list);
	}

	/* Verify list contents */
	{
		int i = 0;
		UpnpListIter list_iter = UpnpListBegin(&list);
		while (list_iter != UpnpListEnd(&list)) {
			struct list_test_item *item =
				(struct list_test_item *)list_iter;

			printf("List item index: %i, expected: %i\n",
				item->index,
				i);
			assert(item->index == i);

			i++;
			list_iter = UpnpListNext(&list, list_iter);
		}
	}

	/* Verify list is still fine */
	assert(UpnpListBegin(&list) != UpnpListEnd(&list));

	/* Clear list */
	{
		int i = 0;
		UpnpListIter list_iter = UpnpListBegin(&list);
		while (list_iter != UpnpListEnd(&list)) {
			struct list_test_item *item =
				(struct list_test_item *)list_iter;

			printf("List item index: %i, expected: %i\n",
				item->index,
				i);
			assert(item->index == i);

			i++;
			list_iter = UpnpListErase(&list, list_iter);
			free(item);
		}
	}

	/* Verify list is cleared */
	assert(UpnpListBegin(&list) == UpnpListEnd(&list));

	UpnpListIter list_iter = UpnpListBegin(&list);
	assert(UpnpListNext(&list, list_iter) == UpnpListEnd(&list));
	assert(list_iter == UpnpListEnd(&list));

	return 0;
}